

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SammyBackgroundRMatrix.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix::
print<std::back_insert_iterator<std::__cxx11::string>>
          (SammyBackgroundRMatrix *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  initializer_list<double> __l;
  allocator_type local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  undefined1 local_a8 [48];
  _Vector_base<double,_std::allocator<double>_> local_78;
  double local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_a8._24_8_ = SEXT48(*(int *)this);
  local_a8._0_8_ = 0;
  local_a8._8_8_ = 0;
  local_a8._16_8_ = 2;
  local_a8._32_16_ = ZEXT816(0);
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_a8,it,MAT,MF,MT);
  local_58 = *(double *)(this + 0x18);
  uStack_50 = *(undefined8 *)(this + 0x20);
  local_48 = *(undefined8 *)(this + 0x28);
  uStack_40 = *(undefined8 *)(this + 0x30);
  local_38 = *(undefined8 *)(this + 0x38);
  local_d8 = *(undefined8 *)(this + 8);
  uStack_d0 = *(undefined8 *)(this + 0x10);
  __l._M_len = 5;
  __l._M_array = &local_58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_c8,__l,&local_d9);
  local_a8._8_8_ =
       (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8._M_impl.super__Vector_impl_data._M_start >> 3;
  local_a8._0_8_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  local_a8._40_4_ = (int)local_d8;
  local_a8._32_8_ = uStack_d0;
  local_a8._44_4_ = (int)((ulong)local_d8 >> 0x20);
  local_78._M_impl.super__Vector_impl_data._M_start =
       local_c8._M_impl.super__Vector_impl_data._M_start;
  local_78._M_impl.super__Vector_impl_data._M_finish =
       local_c8._M_impl.super__Vector_impl_data._M_finish;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ListRecord *)local_a8,it,MAT,MF,MT);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

    ControlRecord( 0.0, 0.0, this->LCH(),
                   this->LBK(), 0, 0 ).print( it, MAT, MF, MT );
    ListRecord( this->ED(), this->EU(), 0 ,0, 0,
                { this->R0(), this->R1(), this->R2(),
                  this->S0(), this->S1() } ).print( it, MAT, MF, MT );
  }